

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O0

_LHASH * OPENSSL_lh_new(lhash_hash_func hash,lhash_cmp_func comp)

{
  void *pvVar1;
  _LHASH *ret;
  lhash_cmp_func comp_local;
  lhash_hash_func hash_local;
  
  hash_local = (lhash_hash_func)OPENSSL_zalloc(0x30);
  if (hash_local == (lhash_hash_func)0x0) {
    hash_local = (lhash_hash_func)0x0;
  }
  else {
    *(undefined8 *)(hash_local + 0x10) = 0x10;
    pvVar1 = OPENSSL_calloc(*(size_t *)(hash_local + 0x10),8);
    *(void **)(hash_local + 8) = pvVar1;
    if (*(long *)(hash_local + 8) == 0) {
      OPENSSL_free(hash_local);
      hash_local = (lhash_hash_func)0x0;
    }
    else {
      *(lhash_cmp_func *)(hash_local + 0x20) = comp;
      *(lhash_hash_func *)(hash_local + 0x28) = hash;
    }
  }
  return (_LHASH *)hash_local;
}

Assistant:

_LHASH *OPENSSL_lh_new(lhash_hash_func hash, lhash_cmp_func comp) {
  _LHASH *ret = reinterpret_cast<_LHASH *>(OPENSSL_zalloc(sizeof(_LHASH)));
  if (ret == NULL) {
    return NULL;
  }

  ret->num_buckets = kMinNumBuckets;
  ret->buckets = reinterpret_cast<LHASH_ITEM **>(
      OPENSSL_calloc(ret->num_buckets, sizeof(LHASH_ITEM *)));
  if (ret->buckets == NULL) {
    OPENSSL_free(ret);
    return NULL;
  }

  ret->comp = comp;
  ret->hash = hash;
  return ret;
}